

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

field_t * SEM_DecList(ast *node,attr *a,int ins)

{
  attr *a_00;
  int iVar1;
  ast *node_00;
  ast *paVar2;
  ast *node_01;
  field_t *pfVar3;
  attr *b;
  field_t *pfVar4;
  
  node_00 = child(node,3);
  paVar2 = child(node,1);
  node_01 = child(paVar2,3);
  paVar2 = child(paVar2,1);
  pfVar3 = SEM_VarDec(paVar2,a,ins);
  if (node_01 != (ast *)0x0) {
    a_00 = pfVar3->type;
    b = SEM_Exp(node_01);
    iVar1 = isequal(a_00,b);
    if (iVar1 == 0) {
      semerror(5,node_01->pos->first_line,semErrorMsg[5]);
    }
    else {
      pfVar3->isInit = 1;
    }
  }
  if (node_00 != (ast *)0x0) {
    pfVar4 = SEM_DecList(node_00,a,ins);
    pfVar3->next = pfVar4;
  }
  return pfVar3;
}

Assistant:

static struct field_t* SEM_DecList(struct ast *node, struct attr *a, int ins) {
    struct ast *child3 = child(node, 3);
    struct field_t *f = SEM_Dec(child(node, 1), a, ins);
    if (child3)
        f->next = SEM_DecList(child3, a, ins);
    return f;
}